

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

bool __thiscall
VmaDefragmentationContext_T::ComputeDefragmentation_Extensive
          (VmaDefragmentationContext_T *this,VmaBlockVector *vector,size_t index)

{
  VmaBlockMetadata *metadata;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  CounterStatus CVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  byte bVar5;
  size_t i;
  size_t sVar6;
  ulong uVar7;
  byte *pbVar8;
  long lVar9;
  bool otherPresent;
  bool bufferPresent;
  bool texturePresent;
  size_t local_80;
  size_t local_78;
  byte *local_70;
  size_t local_68;
  MoveAllocationData moveData;
  VmaAllocHandle handle;
  
code_r0x001a8716:
  if (vector->m_BufferImageGranularity == 1) {
    bVar2 = ComputeDefragmentation_Full(this,vector);
    return bVar2;
  }
  pbVar8 = (byte *)((long)this->m_AlgorithmState + index * 0x10);
  bVar2 = false;
  texturePresent = false;
  bufferPresent = false;
  otherPresent = false;
  bVar5 = *(byte *)((long)this->m_AlgorithmState + index * 0x10);
  switch(bVar5) {
  case 0:
  case 1:
  case 2:
    sVar6 = *(size_t *)(pbVar8 + 8);
    if (sVar6 == 0xffffffffffffffff) {
      sVar6 = (vector->m_Blocks).m_Count;
    }
    else if (sVar6 == 0) {
      *pbVar8 = 6;
      bVar2 = ComputeDefragmentation_Fast(this,vector);
      return bVar2;
    }
    local_80 = sVar6 - 1;
    metadata = (vector->m_Blocks).m_pArray[sVar6 - 1]->m_pMetadata;
    local_68 = (this->m_Moves).m_Count;
    local_78 = index;
    local_70 = pbVar8;
    iVar3 = (*metadata->_vptr_VmaBlockMetadata[0xb])(metadata);
    handle = (VmaAllocHandle)CONCAT44(extraout_var,iVar3);
    while (sVar1 = local_68, pbVar8 = local_70, handle != (VmaAllocHandle)0x0) {
      GetMoveData(&moveData,handle,metadata);
      CVar4 = CheckCounters(this,(moveData.move.srcAllocation)->m_Size);
      if (CVar4 != Ignore) {
        if (CVar4 == End) {
          return true;
        }
        bVar2 = AllocInOtherBlock(this,0,local_80,&moveData,vector);
        if (bVar2) {
          if (local_68 == (this->m_Moves).m_Count) {
            return true;
          }
          iVar3 = (*metadata->_vptr_VmaBlockMetadata[0xc])(metadata,handle);
          if (CONCAT44(extraout_var_01,iVar3) != 0) {
            return true;
          }
          *(size_t *)((long)this->m_AlgorithmState + local_78 * 8) = local_80;
          return true;
        }
      }
      iVar3 = (*metadata->_vptr_VmaBlockMetadata[0xc])(metadata,handle);
      handle = (VmaAllocHandle)CONCAT44(extraout_var_00,iVar3);
    }
    if (local_68 == (this->m_Moves).m_Count) {
      if (local_80 != 0) {
        lVar9 = sVar6 - 2;
        while (lVar9 != 0) {
          bVar2 = ReallocWithinBlock(this,vector,(vector->m_Blocks).m_pArray[lVar9]);
          lVar9 = lVar9 + -1;
          if (bVar2) {
            return true;
          }
        }
        if (sVar1 != (this->m_Moves).m_Count) {
LAB_001a8a3d:
          bVar5 = *pbVar8;
switchD_001a8786_caseD_6:
          if (bVar5 == 6) {
LAB_001a8a46:
            sVar6 = (this->m_Moves).m_Count;
            uVar7 = 0;
            while (uVar7 < (vector->m_Blocks).m_Count) {
              bVar2 = ReallocWithinBlock(this,vector,(vector->m_Blocks).m_pArray[uVar7]);
              uVar7 = uVar7 + 1;
              if (bVar2) {
                return true;
              }
            }
            if (sVar6 == (this->m_Moves).m_Count) {
              *pbVar8 = 7;
            }
          }
          return false;
        }
      }
      bVar2 = ComputeDefragmentation_Fast(this,vector);
    }
    else {
      bVar5 = 3;
      if (*local_70 != 0) {
        bVar5 = *local_70 == 2 | 4;
      }
      *local_70 = bVar5;
      *(size_t *)(local_70 + 8) = local_80;
      bVar2 = ComputeDefragmentation_Extensive(this,vector,local_78);
    }
switchD_001a8786_caseD_7:
    return bVar2;
  case 3:
switchD_001a8786_caseD_3:
    bufferPresent = false;
    otherPresent = false;
    bVar2 = MoveDataToFreeBlocks
                      (this,VMA_SUBALLOCATION_TYPE_BUFFER,vector,*(size_t *)(pbVar8 + 8),
                       &texturePresent,&bufferPresent,&otherPresent);
    if (!bVar2) goto LAB_001a8a3d;
    if (bufferPresent != true) {
      if (otherPresent != true) goto LAB_001a8a23;
      *pbVar8 = 5;
      goto switchD_001a8786_caseD_5;
    }
    break;
  case 4:
    bVar2 = MoveDataToFreeBlocks
                      (this,VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL,vector,*(size_t *)(pbVar8 + 8),
                       &texturePresent,&bufferPresent,&otherPresent);
    if (!bVar2) goto LAB_001a8a3d;
    if (texturePresent != true) {
      if ((bufferPresent != false) || (otherPresent == true)) {
        *pbVar8 = 3;
        goto switchD_001a8786_caseD_3;
      }
      goto LAB_001a8a23;
    }
    *pbVar8 = 1;
    goto code_r0x001a8716;
  case 5:
switchD_001a8786_caseD_5:
    otherPresent = false;
    bVar2 = MoveDataToFreeBlocks
                      (this,VMA_SUBALLOCATION_TYPE_FREE,vector,*(size_t *)(pbVar8 + 8),
                       &texturePresent,&bufferPresent,&otherPresent);
    if (!bVar2) goto LAB_001a8a3d;
    if (otherPresent != true) {
LAB_001a8a23:
      *pbVar8 = 6;
      goto LAB_001a8a46;
    }
    break;
  default:
    goto switchD_001a8786_caseD_6;
  case 7:
    goto switchD_001a8786_caseD_7;
  }
  *pbVar8 = 0;
  goto code_r0x001a8716;
}

Assistant:

bool VmaDefragmentationContext_T::ComputeDefragmentation_Extensive(VmaBlockVector& vector, size_t index)
{
    // First free single block, then populate it to the brim, then free another block, and so on

    // Fallback to previous algorithm since without granularity conflicts it can achieve max packing
    if (vector.m_BufferImageGranularity == 1)
        return ComputeDefragmentation_Full(vector);

    VMA_ASSERT(m_AlgorithmState != VMA_NULL);

    StateExtensive& vectorState = reinterpret_cast<StateExtensive*>(m_AlgorithmState)[index];

    bool texturePresent = false, bufferPresent = false, otherPresent = false;
    switch (vectorState.operation)
    {
    case StateExtensive::Operation::Done: // Vector defragmented
        return false;
    case StateExtensive::Operation::FindFreeBlockBuffer:
    case StateExtensive::Operation::FindFreeBlockTexture:
    case StateExtensive::Operation::FindFreeBlockAll:
    {
        // No more blocks to free, just perform fast realloc and move to cleanup
        if (vectorState.firstFreeBlock == 0)
        {
            vectorState.operation = StateExtensive::Operation::Cleanup;
            return ComputeDefragmentation_Fast(vector);
        }

        // No free blocks, have to clear last one
        size_t last = (vectorState.firstFreeBlock == SIZE_MAX ? vector.GetBlockCount() : vectorState.firstFreeBlock) - 1;
        VmaBlockMetadata* freeMetadata = vector.GetBlock(last)->m_pMetadata;

        const size_t prevMoveCount = m_Moves.size();
        for (VmaAllocHandle handle = freeMetadata->GetAllocationListBegin();
            handle != VK_NULL_HANDLE;
            handle = freeMetadata->GetNextAllocation(handle))
        {
            MoveAllocationData moveData = GetMoveData(handle, freeMetadata);
            switch (CheckCounters(moveData.move.srcAllocation->GetSize()))
            {
            case CounterStatus::Ignore:
                continue;
            case CounterStatus::End:
                return true;
            default:
                VMA_ASSERT(0);
            case CounterStatus::Pass:
                break;
            }

            // Check all previous blocks for free space
            if (AllocInOtherBlock(0, last, moveData, vector))
            {
                // Full clear performed already
                if (prevMoveCount != m_Moves.size() && freeMetadata->GetNextAllocation(handle) == VK_NULL_HANDLE)
                    reinterpret_cast<size_t*>(m_AlgorithmState)[index] = last;
                return true;
            }
        }

        if (prevMoveCount == m_Moves.size())
        {
            // Cannot perform full clear, have to move data in other blocks around
            if (last != 0)
            {
                for (size_t i = last - 1; i; --i)
                {
                    if (ReallocWithinBlock(vector, vector.GetBlock(i)))
                        return true;
                }
            }

            if (prevMoveCount == m_Moves.size())
            {
                // No possible reallocs within blocks, try to move them around fast
                return ComputeDefragmentation_Fast(vector);
            }
        }
        else
        {
            switch (vectorState.operation)
            {
            case StateExtensive::Operation::FindFreeBlockBuffer:
                vectorState.operation = StateExtensive::Operation::MoveBuffers;
                break;
            default:
                VMA_ASSERT(0);
            case StateExtensive::Operation::FindFreeBlockTexture:
                vectorState.operation = StateExtensive::Operation::MoveTextures;
                break;
            case StateExtensive::Operation::FindFreeBlockAll:
                vectorState.operation = StateExtensive::Operation::MoveAll;
                break;
            }
            vectorState.firstFreeBlock = last;
            // Nothing done, block found without reallocations, can perform another reallocs in same pass
            return ComputeDefragmentation_Extensive(vector, index);
        }
        break;
    }
    case StateExtensive::Operation::MoveTextures:
    {
        if (MoveDataToFreeBlocks(VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL, vector,
            vectorState.firstFreeBlock, texturePresent, bufferPresent, otherPresent))
        {
            if (texturePresent)
            {
                vectorState.operation = StateExtensive::Operation::FindFreeBlockTexture;
                return ComputeDefragmentation_Extensive(vector, index);
            }

            if (!bufferPresent && !otherPresent)
            {
                vectorState.operation = StateExtensive::Operation::Cleanup;
                break;
            }

            // No more textures to move, check buffers
            vectorState.operation = StateExtensive::Operation::MoveBuffers;
            bufferPresent = false;
            otherPresent = false;
        }
        else
            break;
    }
    case StateExtensive::Operation::MoveBuffers:
    {
        if (MoveDataToFreeBlocks(VMA_SUBALLOCATION_TYPE_BUFFER, vector,
            vectorState.firstFreeBlock, texturePresent, bufferPresent, otherPresent))
        {
            if (bufferPresent)
            {
                vectorState.operation = StateExtensive::Operation::FindFreeBlockBuffer;
                return ComputeDefragmentation_Extensive(vector, index);
            }

            if (!otherPresent)
            {
                vectorState.operation = StateExtensive::Operation::Cleanup;
                break;
            }

            // No more buffers to move, check all others
            vectorState.operation = StateExtensive::Operation::MoveAll;
            otherPresent = false;
        }
        else
            break;
    }
    case StateExtensive::Operation::MoveAll:
    {
        if (MoveDataToFreeBlocks(VMA_SUBALLOCATION_TYPE_FREE, vector,
            vectorState.firstFreeBlock, texturePresent, bufferPresent, otherPresent))
        {
            if (otherPresent)
            {
                vectorState.operation = StateExtensive::Operation::FindFreeBlockBuffer;
                return ComputeDefragmentation_Extensive(vector, index);
            }
            // Everything moved
            vectorState.operation = StateExtensive::Operation::Cleanup;
        }
        break;
    }
    case StateExtensive::Operation::Cleanup:
        // Cleanup is handled below so that other operations may reuse the cleanup code. This case is here to prevent the unhandled enum value warning (C4062).
        break;
    }

    if (vectorState.operation == StateExtensive::Operation::Cleanup)
    {
        // All other work done, pack data in blocks even tighter if possible
        const size_t prevMoveCount = m_Moves.size();
        for (size_t i = 0; i < vector.GetBlockCount(); ++i)
        {
            if (ReallocWithinBlock(vector, vector.GetBlock(i)))
                return true;
        }

        if (prevMoveCount == m_Moves.size())
            vectorState.operation = StateExtensive::Operation::Done;
    }
    return false;
}